

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O3

bool __thiscall CDBWrapper::Read<unsigned_char,bool>(CDBWrapper *this,uchar *key,bool *value)

{
  Span<const_std::byte> sp;
  long in_FS_OFFSET;
  bool bVar1;
  Span<const_std::byte> key_00;
  DataStream ssValue;
  uint8_t obj;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  strValue;
  DataStream DStack_98;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_78;
  long lStack_60;
  char local_49;
  undefined1 local_48 [32];
  char local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lStack_60 = 0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_78,0x40);
  local_48[0] = *key;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_78,
             local_78._M_impl.super__Vector_impl_data._M_finish,
             (_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              *)local_48);
  key_00.m_data = local_78._M_impl.super__Vector_impl_data._M_start + lStack_60;
  key_00.m_size = (long)local_78._M_impl.super__Vector_impl_data._M_finish - (long)key_00.m_data;
  ReadImpl_abi_cxx11_((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            *)local_48)->_M_value,this,key_00);
  bVar1 = local_28 != '\0';
  if (bVar1) {
    sp.m_data._1_7_ = local_48._1_7_;
    sp.m_data._0_1_ = local_48[0];
    sp.m_size = local_48._8_8_;
    DataStream::DataStream(&DStack_98,sp);
    DataStream::Xor(&DStack_98,&this->obfuscate_key);
    DataStream::read(&DStack_98,(int)&local_49,(void *)0x1,key_00.m_size);
    *value = local_49 != '\0';
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&DStack_98);
  }
  if (local_28 == '\x01') {
    local_28 = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) !=
        &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *)local_48)->_M_value).field_2) {
      operator_delete((undefined1 *)CONCAT71(local_48._1_7_,local_48[0]),local_48._16_8_ + 1);
    }
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool Read(const K& key, V& value) const
    {
        DataStream ssKey{};
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey << key;
        std::optional<std::string> strValue{ReadImpl(ssKey)};
        if (!strValue) {
            return false;
        }
        try {
            DataStream ssValue{MakeByteSpan(*strValue)};
            ssValue.Xor(obfuscate_key);
            ssValue >> value;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }